

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

DotProductLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_dot(NeuralNetworkLayer *this)

{
  bool bVar1;
  DotProductLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_dot(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_dot(this);
    this_00 = (DotProductLayerParams *)operator_new(0x18);
    DotProductLayerParams::DotProductLayerParams(this_00);
    (this->layer_).dot_ = this_00;
  }
  return (DotProductLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::DotProductLayerParams* NeuralNetworkLayer::mutable_dot() {
  if (!has_dot()) {
    clear_layer();
    set_has_dot();
    layer_.dot_ = new ::CoreML::Specification::DotProductLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.dot)
  return layer_.dot_;
}